

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O1

int Lpk_FunComputeMinSuppSizeVar
              (Lpk_Fun_t *p,uint **ppTruths,int nTruths,uint **ppCofs,uint uNonDecSupp)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint iVar;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  uint local_84;
  int local_80;
  int local_7c;
  
  if (0 < nTruths) {
    local_7c = -1;
    lVar4 = 0;
    local_80 = -1;
    local_84 = 0xffffffff;
    do {
      iVar = (uint)lVar4;
      if (((uNonDecSupp >> (iVar & 0x1f) & 1) != 0) && ((1 << ((byte)lVar4 & 0x1f) & p->uSupp) != 0)
         ) {
        lVar5 = 0;
        iVar6 = 0;
        iVar7 = 0;
        do {
          if (nTruths == 1) {
            uVar2 = (p->puSupps[lVar4 * 2] >> 1 & 0x55555555) + (p->puSupps[lVar4 * 2] & 0x55555555)
            ;
            uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
            uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707);
            uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f);
            iVar3 = (uVar2 >> 0x10) + (uVar2 & 0xff);
            uVar2 = (p->puSupps[lVar4 * 2 + 1] >> 1 & 0x55555555) +
                    (p->puSupps[lVar4 * 2 + 1] & 0x55555555);
            uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
            uVar2 = (uVar2 >> 4 & 0x7070707) + (uVar2 & 0x7070707);
            uVar2 = (uVar2 >> 8 & 0xf000f) + (uVar2 & 0xf000f);
            iVar1 = (uVar2 >> 0x10) + (uVar2 & 0xff);
          }
          else {
            Kit_TruthCofactor0New
                      (*(uint **)((long)ppCofs + lVar5 * 2),*(uint **)((long)ppTruths + lVar5),
                       *(uint *)&p->field_0x8 >> 7 & 0x1f,iVar);
            Kit_TruthCofactor1New
                      (*(uint **)((long)ppCofs + lVar5 * 2 + 8),*(uint **)((long)ppTruths + lVar5),
                       *(uint *)&p->field_0x8 >> 7 & 0x1f,iVar);
            iVar3 = Kit_TruthSupportSize
                              (*(uint **)((long)ppCofs + lVar5 * 2),
                               *(uint *)&p->field_0x8 >> 7 & 0x1f);
            iVar1 = Kit_TruthSupportSize
                              (*(uint **)((long)ppCofs + lVar5 * 2 + 8),
                               *(uint *)&p->field_0x8 >> 7 & 0x1f);
          }
          if (iVar6 <= iVar3) {
            iVar6 = iVar3;
          }
          if (iVar6 <= iVar1) {
            iVar6 = iVar1;
          }
          iVar7 = iVar7 + iVar3 + iVar1;
          lVar5 = lVar5 + 8;
        } while ((ulong)(uint)nTruths * 8 != lVar5);
        if (((local_84 == 0xffffffff) || (iVar6 < local_7c)) ||
           ((local_7c == iVar6 && (iVar7 < local_80)))) {
          local_84 = iVar;
          local_80 = iVar7;
          local_7c = iVar6;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    lVar4 = 0;
    do {
      Kit_TruthCofactor0New
                (*(uint **)((long)ppCofs + lVar4 * 2),*(uint **)((long)ppTruths + lVar4),
                 *(uint *)&p->field_0x8 >> 7 & 0x1f,local_84);
      Kit_TruthCofactor1New
                (*(uint **)((long)ppCofs + lVar4 * 2 + 8),*(uint **)((long)ppTruths + lVar4),
                 *(uint *)&p->field_0x8 >> 7 & 0x1f,local_84);
      lVar4 = lVar4 + 8;
    } while ((ulong)(uint)nTruths * 8 != lVar4);
    return local_84;
  }
  __assert_fail("nTruths > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/lpk/lpkAbcDsd.c"
                ,0x36,
                "int Lpk_FunComputeMinSuppSizeVar(Lpk_Fun_t *, unsigned int **, int, unsigned int **, unsigned int)"
               );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Cofactors TTs w.r.t. all vars and finds the best var.]

  Description [The best variable is the variable with the minimum 
  sum total of the support sizes of all truth tables. This procedure 
  computes and returns cofactors w.r.t. the best variable.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Lpk_FunComputeMinSuppSizeVar( Lpk_Fun_t * p, unsigned ** ppTruths, int nTruths, unsigned ** ppCofs, unsigned uNonDecSupp )
{
    int i, Var, VarBest, nSuppSize0, nSuppSize1;
    int nSuppTotalMin = -1; // Suppress "might be used uninitialized"
    int nSuppTotalCur;
    int nSuppMaxMin = -1; // Suppress "might be used uninitialized"
    int nSuppMaxCur;
    assert( nTruths > 0 );
    VarBest = -1;
    Lpk_SuppForEachVar( p->uSupp, Var )
    {
        if ( (uNonDecSupp & (1 << Var)) == 0 )
            continue;
        nSuppMaxCur = 0;
        nSuppTotalCur = 0;
        for ( i = 0; i < nTruths; i++ )
        {
            if ( nTruths == 1 )
            {
                nSuppSize0 = Kit_WordCountOnes( p->puSupps[2*Var+0] );
                nSuppSize1 = Kit_WordCountOnes( p->puSupps[2*Var+1] );
            }
            else
            {
                Kit_TruthCofactor0New( ppCofs[2*i+0], ppTruths[i], p->nVars, Var );
                Kit_TruthCofactor1New( ppCofs[2*i+1], ppTruths[i], p->nVars, Var );
                nSuppSize0 = Kit_TruthSupportSize( ppCofs[2*i+0], p->nVars );
                nSuppSize1 = Kit_TruthSupportSize( ppCofs[2*i+1], p->nVars );
            }        
            nSuppMaxCur = Abc_MaxInt( nSuppMaxCur, nSuppSize0 );
            nSuppMaxCur = Abc_MaxInt( nSuppMaxCur, nSuppSize1 );
            nSuppTotalCur += nSuppSize0 + nSuppSize1;
        }
        if ( VarBest == -1 || nSuppMaxMin > nSuppMaxCur ||
             (nSuppMaxMin == nSuppMaxCur && nSuppTotalMin > nSuppTotalCur) )
        {
            VarBest = Var;
            nSuppMaxMin = nSuppMaxCur;
            nSuppTotalMin = nSuppTotalCur;
        }
    }
    // recompute cofactors for the best var
    for ( i = 0; i < nTruths; i++ )
    {
        Kit_TruthCofactor0New( ppCofs[2*i+0], ppTruths[i], p->nVars, VarBest );
        Kit_TruthCofactor1New( ppCofs[2*i+1], ppTruths[i], p->nVars, VarBest );
    }
    return VarBest;
}